

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessStructuredBuffer
          (ConversionStream *this,iterator *Token,Uint32 *ShaderStorageBlockBinding)

{
  TokenListType *this_00;
  const_iterator __position;
  _List_node_base *p_Var1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  _List_node_base *p_Var5;
  char (*in_RCX) [97];
  _List_node_base **__lhs;
  iterator CurrToken;
  const_iterator cVar6;
  String NameRedefine;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  p_Var5 = Token->_M_node;
  iVar3 = *(int *)&p_Var5[1]._M_next;
  if ((iVar3 != 0x105) && (iVar3 != 0x116)) {
    FormatString<char[26],char[97]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Token->Type == TokenType::kw_StructuredBuffer || Token->Type == TokenType::kw_RWStructuredBuffer"
               ,in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3d9);
    std::__cxx11::string::~string((string *)&msg);
    p_Var5 = Token->_M_node;
    iVar3 = *(int *)&p_Var5[1]._M_next;
  }
  if (iVar3 == 0x105) {
    std::__cxx11::stringstream::stringstream((stringstream *)&msg);
    poVar4 = std::operator<<((ostream *)msg.field_2._M_local_buf,"layout(binding=");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4,") buffer");
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&Token->_M_node[1]._M_prev,(string *)&NameRedefine);
    std::__cxx11::string::~string((string *)&NameRedefine);
    *ShaderStorageBlockBinding = *ShaderStorageBlockBinding + 1;
    std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
  }
  else {
    std::__cxx11::string::assign((char *)&p_Var5[1]._M_prev);
  }
  p_Var5 = Token->_M_node->_M_next;
  Token->_M_node = p_Var5;
  this_00 = &this->m_Tokens;
  if (p_Var5 == (_List_node_base *)this_00) {
    FormatString<char[48]>(&msg,(char (*) [48])"Unexpected EOF after \"StructuredBuffer\" keyword");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&NameRedefine,this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3e9,&msg,(char (*) [2])0x2c8293,&NameRedefine);
    std::__cxx11::string::~string((string *)&NameRedefine);
    std::__cxx11::string::~string((string *)&msg);
    p_Var5 = Token->_M_node;
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &p_Var5[1]._M_prev,"<");
  if (!bVar2) {
    FormatString<char[46]>(&msg,(char (*) [46])"\'<\' expected after \"StructuredBuffer\" keyword");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&NameRedefine,this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3ea,&msg,(char (*) [2])0x2c8293,&NameRedefine);
    std::__cxx11::string::~string((string *)&NameRedefine);
    std::__cxx11::string::~string((string *)&msg);
  }
  std::__cxx11::string::assign((char *)&Token->_M_node[1]._M_prev);
  cVar6._M_node = Token->_M_node;
  *(undefined4 *)&cVar6._M_node[1]._M_next = 0x133;
  p_Var5 = (cVar6._M_node)->_M_next;
  Token->_M_node = p_Var5;
  if (p_Var5 == (_List_node_base *)this_00) {
    FormatString<char[21]>(&msg,(char (*) [21])"Unexpected EOF after");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&NameRedefine,this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3f4,&msg,(char (*) [2])0x2c8293,&NameRedefine);
    std::__cxx11::string::~string((string *)&NameRedefine);
    std::__cxx11::string::~string((string *)&msg);
    p_Var5 = Token->_M_node;
  }
  if (0xbe < *(int *)&p_Var5[1]._M_next - 1U && *(int *)&p_Var5[1]._M_next != 0x13b) {
    FormatString<char[72]>
              (&msg,(char (*) [72])
                    "Identifier or built-in type is expected in Structured Buffer definition");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&NameRedefine,this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3f5,&msg,(char (*) [2])0x2c8293,&NameRedefine);
    std::__cxx11::string::~string((string *)&NameRedefine);
    std::__cxx11::string::~string((string *)&msg);
    p_Var5 = Token->_M_node;
  }
  p_Var5 = p_Var5->_M_next;
  Token->_M_node = p_Var5;
  if (p_Var5 == (_List_node_base *)this_00) {
    FormatString<char[47]>(&msg,(char (*) [47])"Unexpected EOF in Structured Buffer definition");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&NameRedefine,this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3fa,&msg,(char (*) [2])0x2c8293,&NameRedefine);
    std::__cxx11::string::~string((string *)&NameRedefine);
    std::__cxx11::string::~string((string *)&msg);
    p_Var5 = Token->_M_node;
  }
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &p_Var5[1]._M_prev,">");
  if (!bVar2) {
    FormatString<char[35]>(&msg,(char (*) [35])"\'>\' expected after type definition");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&NameRedefine,this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x3fb,&msg,(char (*) [2])0x2c8293,&NameRedefine);
    std::__cxx11::string::~string((string *)&NameRedefine);
    std::__cxx11::string::~string((string *)&msg);
  }
  __position._M_node = Token->_M_node;
  Token->_M_node = (__position._M_node)->_M_next;
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::erase
            (this_00,__position);
  p_Var5 = Token->_M_node;
  if (p_Var5 == (_List_node_base *)this_00) {
    FormatString<char[21]>(&msg,(char (*) [21])"Unexpected EOF after");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&NameRedefine,this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x401,&msg,(char (*) [2])0x2c8293,&NameRedefine);
    std::__cxx11::string::~string((string *)&NameRedefine);
    std::__cxx11::string::~string((string *)&msg);
    p_Var5 = Token->_M_node;
  }
  if (*(int *)&p_Var5[1]._M_next != 0x13b) {
    FormatString<char[52]>
              (&msg,(char (*) [52])"Identifier expected in Structured Buffer definition");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&NameRedefine,this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x402,&msg,(char (*) [2])0x2c8293,&NameRedefine);
    std::__cxx11::string::~string((string *)&NameRedefine);
    std::__cxx11::string::~string((string *)&msg);
    p_Var5 = Token->_M_node;
  }
  if (p_Var5[4]._M_next == (_List_node_base *)0x0) {
    std::__cxx11::string::assign((char *)&p_Var5[3]._M_prev);
    p_Var5 = Token->_M_node;
  }
  std::__cxx11::string::string
            ((string *)&local_48,(char *)p_Var5[1]._M_prev,(allocator *)&NameRedefine);
  std::__cxx11::string::string((string *)&local_68," ",(allocator *)&local_370);
  Parsing::HLSLTokenInfo::HLSLTokenInfo
            ((HLSLTokenInfo *)&msg,Identifier,&local_48,&local_68,0xffffffffffffffff);
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>(this_00,cVar6,(HLSLTokenInfo *)&msg);
  Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&msg);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  p_Var5 = Token->_M_node;
  p_Var1 = p_Var5->_M_next;
  Token->_M_node = p_Var1;
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &p_Var1[1]._M_prev,":");
  if (bVar2) {
    while ((cVar6._M_node = Token->_M_node, cVar6._M_node != (_List_node_base *)this_00 &&
           (*(int *)&cVar6._M_node[1]._M_next != 0x13e))) {
      Token->_M_node = (cVar6._M_node)->_M_next;
      std::__cxx11::
      list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
      erase(this_00,cVar6);
    }
  }
  else {
    cVar6._M_node = Token->_M_node;
  }
  if (cVar6._M_node == (_List_node_base *)this_00) {
    FormatString<char[21]>(&msg,(char (*) [21])"Unexpected EOF after");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&NameRedefine,this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x421,&msg,(char (*) [2])0x2c8293,&NameRedefine);
    std::__cxx11::string::~string((string *)&NameRedefine);
    std::__cxx11::string::~string((string *)&msg);
    cVar6._M_node = Token->_M_node;
  }
  if (*(int *)&cVar6._M_node[1]._M_next != 0x13e) {
    FormatString<char[13]>(&msg,(char (*) [13])"\';\' expected");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              (&NameRedefine,this,Token,4);
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"ProcessStructuredBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x422,&msg,(char (*) [2])0x2c8293,&NameRedefine);
    std::__cxx11::string::~string((string *)&NameRedefine);
    std::__cxx11::string::~string((string *)&msg);
    cVar6._M_node = Token->_M_node;
  }
  std::__cxx11::string::string((string *)&local_88,"[",(allocator *)&NameRedefine);
  std::__cxx11::string::string((string *)&local_a8,"",(allocator *)&local_370);
  Parsing::HLSLTokenInfo::HLSLTokenInfo
            ((HLSLTokenInfo *)&msg,OpenSquareBracket,&local_88,&local_a8,0xffffffffffffffff);
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>(this_00,cVar6,(HLSLTokenInfo *)&msg);
  Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&msg);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  cVar6._M_node = Token->_M_node;
  std::__cxx11::string::string((string *)&local_c8,"]",(allocator *)&NameRedefine);
  std::__cxx11::string::string((string *)&local_e8,"",(allocator *)&local_370);
  Parsing::HLSLTokenInfo::HLSLTokenInfo
            ((HLSLTokenInfo *)&msg,ClosingSquareBracket,&local_c8,&local_e8,0xffffffffffffffff);
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>(this_00,cVar6,(HLSLTokenInfo *)&msg);
  Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&msg);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  cVar6._M_node = Token->_M_node;
  std::__cxx11::string::string((string *)&local_108,";",(allocator *)&NameRedefine);
  std::__cxx11::string::string((string *)&local_128,"",(allocator *)&local_370);
  Parsing::HLSLTokenInfo::HLSLTokenInfo
            ((HLSLTokenInfo *)&msg,Semicolon,&local_108,&local_128,0xffffffffffffffff);
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>(this_00,cVar6,(HLSLTokenInfo *)&msg);
  Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&msg);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  cVar6._M_node = Token->_M_node;
  std::__cxx11::string::string((string *)&local_148,"}",(allocator *)&NameRedefine);
  std::__cxx11::string::string((string *)&local_168,"",(allocator *)&local_370);
  Parsing::HLSLTokenInfo::HLSLTokenInfo
            ((HLSLTokenInfo *)&msg,ClosingBrace,&local_148,&local_168,0xffffffffffffffff);
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>(this_00,cVar6,(HLSLTokenInfo *)&msg);
  Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&msg);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  Token->_M_node = Token->_M_node->_M_next;
  std::__cxx11::string::string((string *)&NameRedefine,"#define ",(allocator *)&msg);
  __lhs = &p_Var5[1]._M_prev;
  std::operator+(&local_1c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,' ');
  std::operator+(&local_370,&local_1c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs);
  std::operator+(&msg,&local_370,"_data\r\n");
  std::__cxx11::string::append((string *)&NameRedefine);
  std::__cxx11::string::~string((string *)&msg);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_1c8);
  cVar6._M_node = Token->_M_node;
  std::__cxx11::string::string
            ((string *)&local_188,NameRedefine._M_dataplus._M_p,(allocator *)&local_370);
  std::__cxx11::string::string((string *)&local_1a8,"\r\n",(allocator *)&local_1c8);
  Parsing::HLSLTokenInfo::HLSLTokenInfo
            ((HLSLTokenInfo *)&msg,TextBlock,&local_188,&local_1a8,0xffffffffffffffff);
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  emplace<Diligent::Parsing::HLSLTokenInfo>(this_00,cVar6,(HLSLTokenInfo *)&msg);
  Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&msg);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::append((char *)__lhs);
  std::__cxx11::string::~string((string *)&NameRedefine);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessStructuredBuffer(TokenListType::iterator& Token, Uint32& ShaderStorageBlockBinding)
{
    // StructuredBuffer<DataType> g_Data;
    // ^
    VERIFY_EXPR(Token->Type == TokenType::kw_StructuredBuffer || Token->Type == TokenType::kw_RWStructuredBuffer);
    if (Token->Type == TokenType::kw_RWStructuredBuffer)
    {
        std::stringstream ss;
        ss << "layout(binding=" << ShaderStorageBlockBinding << ") buffer";
        Token->Literal = ss.str();
        ++ShaderStorageBlockBinding;
    }
    else
        Token->Literal = "readonly buffer";
    // buffer<DataType> g_Data;
    // ^

    ++Token;
    // buffer<DataType> g_Data;
    //       ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF after \"StructuredBuffer\" keyword");
    VERIFY_PARSER_STATE(Token, Token->Literal == "<", "\'<\' expected after \"StructuredBuffer\" keyword");
    Token->Literal = "{";
    Token->Type    = TokenType::OpenBrace;
    // buffer{DataType> g_Data;
    //       ^
    auto OpenBraceToken = Token;

    ++Token;
    // buffer{DataType> g_Data;
    //        ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF after");
    VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Identifier || Token->IsBuiltInType(), "Identifier or built-in type is expected in Structured Buffer definition");

    ++Token;
    // buffer{DataType> g_Data;
    //                ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF in Structured Buffer definition");
    VERIFY_PARSER_STATE(Token, Token->Literal == ">", "\'>\' expected after type definition");
    auto ClosingAngleBracketTkn = Token;
    ++Token;
    m_Tokens.erase(ClosingAngleBracketTkn);
    // buffer{DataType g_Data;
    //                 ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF after");
    VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Identifier, "Identifier expected in Structured Buffer definition");
    if (Token->Delimiter.empty())
        Token->Delimiter = " ";

    m_Tokens.insert(OpenBraceToken, TokenInfo(TokenType::Identifier, Token->Literal.c_str(), " "));
    //          OpenBraceToken
    //              V
    // buffer g_Data{DataType g_Data;
    //                        ^
    auto GlobalVarNameToken = Token;

    ++Token;
    // buffer g_Data{DataType g_Data;
    //                              ^

    if (Token->Literal == ":")
    {
        // buffer g_Data{DataType g_Data : register(t0);
        //                               ^

        // Remove register
        while (Token != m_Tokens.end() && Token->Type != TokenType::Semicolon)
        {
            auto CurrToken = Token;
            ++Token;
            m_Tokens.erase(CurrToken);
        }

        // buffer g_Data{DataType g_Data ;
        //                               ^
    }
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF after");
    VERIFY_PARSER_STATE(Token, Token->Type == TokenType::Semicolon, "\';\' expected");

    m_Tokens.insert(Token, TokenInfo(TokenType::OpenSquareBracket, "["));
    m_Tokens.insert(Token, TokenInfo(TokenType::ClosingSquareBracket, "]"));
    m_Tokens.insert(Token, TokenInfo(TokenType::Semicolon, ";"));
    m_Tokens.insert(Token, TokenInfo(TokenType::ClosingBrace, "}"));
    // buffer g_Data{DataType g_Data[]};
    //                                 ^
    ++Token;
    String NameRedefine("#define ");
    NameRedefine += GlobalVarNameToken->Literal + ' ' + GlobalVarNameToken->Literal + "_data\r\n";
    m_Tokens.insert(Token, TokenInfo(TokenType::TextBlock, NameRedefine.c_str(), "\r\n"));
    GlobalVarNameToken->Literal.append("_data");
    // buffer g_Data{DataType g_Data_data[]};
    // #define g_Data g_Data_data
    //                           ^
}